

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O0

void lmpar(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double delta,double *par,
          double *x,double *sdiag)

{
  int iVar1;
  double *x_00;
  double *x_01;
  double dVar2;
  double dVar3;
  double dVar4;
  double *wa2;
  double *wa1;
  double zero;
  double temp;
  double sum;
  double p001;
  double p1;
  double paru;
  double parl;
  double parc;
  double gnorm;
  double fp;
  double dwarf;
  double dxnorm;
  int nsing;
  int l;
  int k;
  int jp1;
  int jm1;
  int j;
  int iter;
  int i;
  double delta_local;
  double *qtb_local;
  double *diag_local;
  int *ipvt_local;
  int N_local;
  int ldr_local;
  double *r_local;
  
  x_00 = (double *)malloc((long)N << 3);
  x_01 = (double *)malloc((long)N << 3);
  dxnorm._0_4_ = N;
  for (jp1 = 1; jp1 <= N; jp1 = jp1 + 1) {
    x_00[jp1 + -1] = qtb[jp1 + -1];
    if (((r[(jp1 + -1) * N + jp1 + -1] == 0.0) && (!NAN(r[(jp1 + -1) * N + jp1 + -1]))) &&
       (dxnorm._0_4_ == N)) {
      dxnorm._0_4_ = jp1 + -1;
    }
    if (dxnorm._0_4_ < N) {
      x_00[jp1 + -1] = 0.0;
    }
  }
  if (0 < dxnorm._0_4_) {
    for (nsing = 1; nsing <= dxnorm._0_4_; nsing = nsing + 1) {
      iVar1 = dxnorm._0_4_ - nsing;
      x_00[iVar1] = x_00[iVar1] / r[iVar1 * N + iVar1 + 1 + -1];
      dVar2 = x_00[iVar1];
      if (0 < iVar1) {
        for (j = 1; j <= iVar1; j = j + 1) {
          x_00[j + -1] = -r[(j + -1) * N + iVar1 + 1 + -1] * dVar2 + x_00[j + -1];
        }
      }
    }
  }
  for (jp1 = 0; jp1 < N; jp1 = jp1 + 1) {
    x[ipvt[jp1]] = x_00[jp1];
  }
  jm1 = 0;
  for (jp1 = 0; jp1 < N; jp1 = jp1 + 1) {
    x_01[jp1] = diag[jp1] * x[jp1];
  }
  dVar2 = enorm(x_01,N);
  gnorm = dVar2 - delta;
  if (delta * 0.1 < gnorm) {
    paru = 0.0;
    if (N <= dxnorm._0_4_) {
      for (jp1 = 0; jp1 < N; jp1 = jp1 + 1) {
        x_00[jp1] = diag[ipvt[jp1]] * (x_01[ipvt[jp1]] / dVar2);
      }
      for (jp1 = 0; jp1 < N; jp1 = jp1 + 1) {
        temp = 0.0;
        if (-1 < jp1 + -1) {
          for (j = 0; j <= jp1 + -1; j = j + 1) {
            temp = r[j * N + jp1] * x_00[j] + temp;
          }
        }
        x_00[jp1] = (x_00[jp1] - temp) / r[jp1 * N + jp1];
      }
      dVar3 = enorm(x_00,N);
      paru = ((gnorm / delta) / dVar3) / dVar3;
    }
    for (jp1 = 0; jp1 < N; jp1 = jp1 + 1) {
      temp = 0.0;
      for (j = 0; j <= jp1; j = j + 1) {
        temp = r[j * N + jp1] * qtb[j] + temp;
      }
      x_00[jp1] = temp / diag[ipvt[jp1]];
    }
    dVar3 = enorm(x_00,N);
    p1 = dVar3 / delta;
    if ((p1 == 0.0) && (!NAN(p1))) {
      dVar4 = pmin(delta,0.1);
      p1 = 2.22507385852e-308 / dVar4;
    }
    dVar4 = pmax(*par,paru);
    *par = dVar4;
    dVar4 = pmin(*par,p1);
    *par = dVar4;
    if ((*par == 0.0) && (!NAN(*par))) {
      *par = dVar3 / dVar2;
    }
    while( true ) {
      jm1 = jm1 + 1;
      if ((*par == 0.0) && (!NAN(*par))) {
        dVar2 = pmax(2.22507385852e-308,p1 * 0.001);
        *par = dVar2;
      }
      dVar2 = sqrt(*par);
      for (jp1 = 0; jp1 < N; jp1 = jp1 + 1) {
        x_00[jp1] = dVar2 * diag[jp1];
      }
      qrsolv(r,ldr,N,ipvt,x_00,qtb,x,sdiag);
      for (jp1 = 0; jp1 < N; jp1 = jp1 + 1) {
        x_01[jp1] = diag[jp1] * x[jp1];
      }
      dVar2 = enorm(x_01,N);
      dVar3 = dVar2 - delta;
      if (((ABS(dVar3) <= delta * 0.1) || (jm1 == 10)) ||
         ((paru == 0.0 && (((!NAN(paru) && (dVar3 <= gnorm)) && (gnorm < 0.0)))))) break;
      for (jp1 = 0; jp1 < N; jp1 = jp1 + 1) {
        x_00[jp1] = diag[ipvt[jp1]] * (x_01[ipvt[jp1]] / dVar2);
      }
      for (jp1 = 0; jp1 < N; jp1 = jp1 + 1) {
        x_00[jp1] = x_00[jp1] / sdiag[jp1];
        dVar2 = x_00[jp1];
        j = jp1;
        if (jp1 + 2 <= N) {
          while (j = j + 1, j < N) {
            x_00[j] = -r[j * N + jp1] * dVar2 + x_00[j];
          }
        }
      }
      dVar2 = enorm(x_00,N);
      if (0.0 < dVar3) {
        paru = pmax(paru,*par);
      }
      if (dVar3 < 0.0) {
        p1 = pmin(p1,*par);
      }
      dVar2 = pmax(paru,*par + ((dVar3 / delta) / dVar2) / dVar2);
      *par = dVar2;
      gnorm = dVar3;
    }
  }
  if (jm1 == 0) {
    *par = 0.0;
  }
  free(x_00);
  free(x_01);
  return;
}

Assistant:

void lmpar(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double delta,double *par,double *x,double *sdiag) {
	int i,iter,j,jm1,jp1,k,l,nsing;
	double dxnorm,dwarf,fp,gnorm,parc,parl,paru,p1,p001,sum,temp,zero;
	double *wa1,*wa2;
	/*
	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more

	 * N is a positive integer input variable set to the order of r.

       r is an N by N array. on input the full upper triangle
         must contain the full upper triangle of the matrix r.
         on output the full upper triangle is unaltered, and the
         strict lower triangle contains the strict upper triangle
         (transposed) of the upper triangular matrix s.

       ldr is a positive integer input variable not less than n
         which specifies the leading dimension of the array r.

       ipvt is an integer input array of length N which defines the
         permutation matrix p such that a*p = q*r. column j of p
         is column ipvt(j) of the identity matrix.

       diag is an input array of length N which must contain the
         diagonal elements of the matrix d.

       qtb is an input array of length N which must contain the first
         N elements of the vector (q transpose)*b.

       delta is a positive input variable which specifies an upper
         bound on the euclidean norm of d*x.

       par is a nonnegative variable. on input par contains an
         initial estimate of the levenberg-marquardt parameter.
         on output par contains the final estimate.

       x is an output array of length N which contains the least
         squares solution of the system a*x = b, sqrt(par)*d*x = 0,
         for the output par.

       sdiag is an output array of length N which contains the
         diagonal elements of the upper triangular matrix s.
    */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);

	p1 = 1.0e-01;
	p001 = 1.0e-03;
	zero = 0.0;
	dwarf = 2.22507385852e-308;

	//     compute and store in x the gauss-newton direction. if the
	//     jacobian is rank-deficient, obtain a least squares solution.

	nsing = N;

	for(j = 1; j <= N;++j) {
		wa1[j-1] = qtb[j-1];
		if (r[(j-1)*N+j-1] == zero && nsing == N) {
			nsing = j - 1;
		}
		if (nsing < N) {
			wa1[j-1] = zero;
		}
	}

	if (nsing >= 1) {//50
		for(k = 1; k <= nsing;++k) {
	         j = nsing - k + 1;
	         wa1[j-1] = wa1[j-1]/r[(j-1)*N+j-1];
	         temp = wa1[j-1];
	         jm1 = j - 1;
	         if (jm1 >= 1) {
	        	 for(i = 1; i <= jm1;++i) {
	        		 wa1[i-1] = wa1[i-1] - r[(i-1)*N+j-1]*temp;
	        	 }
	         }
		}
	}//50

	for (j = 0; j < N;++j) {
        l = ipvt[j];
        x[l] = wa1[j];
	}

	//     initialize the iteration counter.
	//     evaluate the function at the origin, and test
	//     for acceptance of the gauss-newton direction.

	iter = 0;

	for(j = 0; j < N;++j) {
		wa2[j] = diag[j]*x[j];
	}

	dxnorm = enorm(wa2,N);
	fp = dxnorm - delta;

	if (fp > p1*delta) {//220
		//     if the jacobian is not rank deficient, the newton
		//    step provides a lower bound, parl, for the zero of
		//     the function. otherwise set this bound to zero.
		parl = zero;

		if (nsing >= N) { //120 nsing only takes values upto N
			for(j = 0; j < N;++j) {
				l = ipvt[j];
				wa1[j] = diag[l]*(wa2[l]/dxnorm);
			}

			for(j = 0; j < N;++j) {//110
		         sum = zero;
		         jm1 = j - 1;
		         if (jm1 >= 0) {//100
		        	 for(i = 0; i <= jm1;++i) {//check
		        		 sum = sum + r[i*N+j]*wa1[i];
		        	 }
		         }//100
		         wa1[j] = (wa1[j] - sum)/r[j*N+j];
			}//110
		      temp = enorm(wa1,N);
		      parl = ((fp/delta)/temp)/temp;
		}//120

		//     calculate an upper bound, paru, for the zero of the function.

		for(j = 0; j < N;++j) {//140
			sum = zero;
			for(i = 0; i <= j;++i) {//check
				sum = sum + r[i*N+j]*qtb[i];
			}
	         l = ipvt[j];
	         wa1[j] = sum/diag[l];
		}//140
		gnorm = enorm(wa1,N);
		paru = gnorm/delta;

		if (paru == zero) {
			paru = dwarf/pmin(delta,p1);
		}

		//     if the input par lies outside of the interval (parl,paru),
		//     set par to the closer endpoint.

	      *par = pmax(*par,parl);
	      *par = pmin(*par,paru);

	      if (*par == zero) {
	    	  *par = gnorm/dxnorm;
	      }
	      //Iteration begins
	      while(1) {
	    	  iter++;
	    	  //        evaluate the function at the current value of par.
	    	  if (*par == zero) {
	    		  *par = pmax(dwarf,p001*paru);
	    	  }
	    	  temp = sqrt(*par);
	    	  for(j = 0; j < N;++j) {
	    		  wa1[j] = temp*diag[j];
	    	  }

	    	  qrsolv(r,ldr,N,ipvt,wa1,qtb,x,sdiag);
	    	  for(j = 0; j < N;++j) {
	              wa2[j] = diag[j]*x[j];
	    	  }

	          dxnorm = enorm(wa2,N);
	          temp = fp;
	          fp = dxnorm - delta;

	          //        if the function is small enough, accept the current value
	          //        of par. also test for the exceptional cases where parl
	          //        is zero or the number of iterations has reached 10.
	          if (fabs(fp) <= p1*delta) {
	        	  break;
	          }

	          if (iter == 10) {
	        	  break;
	          }

	          if (parl == zero && fp <= temp && temp < zero) {
	        	  break;
	          }

	          //        compute the newton correction.

	          for(j = 0;j < N;++j) {//180
	              l = ipvt[j];
	              wa1[j] = diag[l]*(wa2[l]/dxnorm);
	          }//180

	          for(j = 0; j < N;++j) {//210
	              wa1[j] = wa1[j]/sdiag[j];
	              temp = wa1[j];
	              jp1 = j + 1;
	              if (N >= jp1+1) {
	            	  for(i = jp1; i < N;++i) {
	            		  wa1[i] = wa1[i] - r[i*N+j]*temp;
	            	  }
	              }
	          }//210
	          temp = enorm(wa1,N);
	          parc = ((fp/delta)/temp)/temp;
	          //        depending on the sign of the function, update parl or paru.

	          if (fp > zero) {
	        	  parl = pmax(parl,*par);
	          }
	          if (fp < zero) {
	        	  paru = pmin(paru,*par);
	          }

	          //       compute an improved estimate for par.
	          *par = pmax(parl,*par+parc);

	      }

	}//220

	if (iter == 0) {
		*par = zero;
	}

	free(wa1);
	free(wa2);
}